

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ExtraMessageInterfaces_abi_cxx11_
          (string *__return_storage_ptr__,java *this,Descriptor *descriptor)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"// @@protoc_insertion_point(message_implements:",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8));
  std::operator+(__return_storage_ptr__,&local_30,")");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string ExtraMessageInterfaces(const Descriptor* descriptor) {
  string interfaces = "// @@protoc_insertion_point(message_implements:"
      + descriptor->full_name() + ")";
  return interfaces;
}